

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_CopySubArray(JSContext *ctx,JSValue obj,int64_t to_pos,int64_t from_pos,int64_t count,int dir
                   )

{
  int iVar1;
  long idx;
  long idx_00;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  long lVar5;
  bool bVar6;
  JSValue val;
  
  iVar4 = 0;
  if (0 < count) {
    iVar4 = count;
  }
  lVar5 = count + to_pos;
  lVar2 = count + from_pos;
  lVar3 = 0;
  while( true ) {
    lVar5 = lVar5 + -1;
    lVar2 = lVar2 + -1;
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar6) {
      return 0;
    }
    idx = lVar2;
    idx_00 = lVar5;
    if (-1 < dir) {
      idx = from_pos + lVar3;
      idx_00 = to_pos + lVar3;
    }
    iVar1 = JS_TryGetPropertyInt64(ctx,obj,idx,&val);
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      iVar1 = JS_DeletePropertyInt64(ctx,obj,idx_00,0x4000);
    }
    else {
      iVar1 = JS_SetPropertyInt64(ctx,obj,idx_00,val);
    }
    if (iVar1 < 0) {
      return -1;
    }
    lVar3 = lVar3 + 1;
  }
  return -1;
}

Assistant:

static int JS_CopySubArray(JSContext *ctx,
                           JSValueConst obj, int64_t to_pos,
                           int64_t from_pos, int64_t count, int dir)
{
    int64_t i, from, to;
    JSValue val;
    int fromPresent;

    /* XXX: should special case fast arrays */
    for (i = 0; i < count; i++) {
        if (dir < 0) {
            from = from_pos + count - i - 1;
            to = to_pos + count - i - 1;
        } else {
            from = from_pos + i;
            to = to_pos + i;
        }
        fromPresent = JS_TryGetPropertyInt64(ctx, obj, from, &val);
        if (fromPresent < 0)
            goto exception;

        if (fromPresent) {
            if (JS_SetPropertyInt64(ctx, obj, to, val) < 0)
                goto exception;
        } else {
            if (JS_DeletePropertyInt64(ctx, obj, to, JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    return 0;

 exception:
    return -1;
}